

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

GroupByNode *
duckdb::Parser::ParseGroupByList
          (GroupByNode *__return_storage_ptr__,string *group_by,ParserOptions options)

{
  reference pvVar1;
  pointer pSVar2;
  SelectStatement *pSVar3;
  pointer this;
  SelectNode *pSVar4;
  ParserException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_c9;
  Parser parser;
  string local_98;
  string local_78 [32];
  string mock_query;
  string local_38;
  
  ::std::__cxx11::string::string(local_78,"SELECT 42 GROUP BY %s",(allocator *)&parser);
  ::std::__cxx11::string::string((string *)&local_98,(string *)group_by);
  StringUtil::Format<std::__cxx11::string>(&mock_query,(StringUtil *)local_78,&local_98,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string(local_78);
  Parser(&parser,options);
  ParseQuery(&parser,&mock_query);
  if ((long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::get<true>(&parser.statements,0);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(pvVar1);
    if (pSVar2->type == SELECT_STATEMENT) {
      pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
               ::get<true>(&parser.statements,0);
      pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(pvVar1);
      pSVar3 = SQLStatement::Cast<duckdb::SelectStatement>(pSVar2);
      this = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       (&pSVar3->node);
      pSVar4 = QueryNode::Cast<duckdb::SelectNode>(this);
      GroupByNode::GroupByNode(__return_storage_ptr__,&pSVar4->groups);
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&parser);
      ::std::__cxx11::string::~string((string *)&mock_query);
      return __return_storage_ptr__;
    }
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Expected a single SELECT statement",&local_c9)
  ;
  ParserException::ParserException(this_00,&local_38);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

GroupByNode Parser::ParseGroupByList(const string &group_by, ParserOptions options) {
	// construct a mock SELECT query with our group_by expressions
	string mock_query = StringUtil::Format("SELECT 42 GROUP BY %s", group_by);
	// parse the query
	Parser parser(options);
	parser.ParseQuery(mock_query);
	// check the result
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::SELECT_STATEMENT) {
		throw ParserException("Expected a single SELECT statement");
	}
	auto &select = parser.statements[0]->Cast<SelectStatement>();
	D_ASSERT(select.node->type == QueryNodeType::SELECT_NODE);
	auto &select_node = select.node->Cast<SelectNode>();
	return std::move(select_node.groups);
}